

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O2

int32_t u_memcmp_63(UChar *buf1,UChar *buf2,int32_t count)

{
  UChar *pUVar1;
  
  if (0 < count) {
    pUVar1 = buf1 + (uint)count;
    for (; buf1 < pUVar1; buf1 = buf1 + 1) {
      if ((uint)(ushort)*buf1 - (uint)(ushort)*buf2 != 0) {
        return (uint)(ushort)*buf1 - (uint)(ushort)*buf2;
      }
      buf2 = buf2 + 1;
    }
  }
  return 0;
}

Assistant:

U_CAPI int32_t U_EXPORT2
u_memcmp(const UChar *buf1, const UChar *buf2, int32_t count) {
    if(count > 0) {
        const UChar *limit = buf1 + count;
        int32_t result;

        while (buf1 < limit) {
            result = (int32_t)(uint16_t)*buf1 - (int32_t)(uint16_t)*buf2;
            if (result != 0) {
                return result;
            }
            buf1++;
            buf2++;
        }
    }
    return 0;
}